

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackDebGenerator.cxx
# Opt level: O3

int __thiscall cmCPackDebGenerator::createDeb(cmCPackDebGenerator *this)

{
  _Base_ptr *pp_Var1;
  cmCPackLog *pcVar2;
  undefined4 uVar3;
  uint uVar4;
  cmCPackDebGenerator *pcVar5;
  size_type sVar6;
  size_t sVar7;
  bool bVar8;
  int iVar9;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  char *__s;
  char *__s_00;
  char *__s_01;
  char *__s_02;
  char *__s_03;
  char *__s_04;
  char *__s_05;
  char *__s_06;
  char *__s_07;
  char *__s_08;
  char *__s_09;
  char *__s_10;
  char *__s_11;
  ostream *poVar13;
  size_t sVar14;
  long *plVar15;
  iterator iVar16;
  string *psVar17;
  FILE *__s_12;
  FILE *__stream;
  size_t sVar18;
  size_t sVar19;
  _func_int **pp_Var20;
  long *plVar21;
  size_type *psVar22;
  _Alloc_hider _Var23;
  size_t off;
  pointer pbVar24;
  ulong uVar25;
  cmCPackDebGenerator *local_23c8;
  allocator local_23b9;
  string dbfilename;
  int retval;
  string topLevelString;
  string output;
  string outputFileName;
  string cmd;
  string md5filename;
  string cmake_tar;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  installDirs;
  string dirName;
  uint local_2250;
  size_t local_2240;
  __time_t local_2218;
  ios_base local_2200 [264];
  string compression_suffix;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arFiles;
  string ctlfilename;
  string compression_modifier;
  string debian_pkg_name;
  cmGeneratedFileStream out;
  
  dbfilename._M_dataplus._M_p = (pointer)&dbfilename.field_2;
  dbfilename._M_string_length = 0;
  dbfilename.field_2._M_local_buf[0] = '\0';
  out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&out,"GEN_WDIR","");
  local_23c8 = this;
  cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&out);
  std::__cxx11::string::append((char *)&dbfilename);
  if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)
      &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1
                   );
  }
  std::__cxx11::string::append((char *)&dbfilename);
  cmGeneratedFileStream::cmGeneratedFileStream(&out,dbfilename._M_dataplus._M_p,false);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"2.0",3);
  std::ios::widen((char)&out +
                  (char)out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                        _vptr_basic_ostream[-3]);
  std::ostream::put((char)&out);
  std::ostream::flush();
  cmGeneratedFileStream::~cmGeneratedFileStream(&out);
  ctlfilename._M_dataplus._M_p = (pointer)&ctlfilename.field_2;
  ctlfilename._M_string_length = 0;
  ctlfilename.field_2._M_local_buf[0] = '\0';
  out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&out,"GEN_WDIR","");
  pcVar10 = cmCPackGenerator::GetOption(&local_23c8->super_cmCPackGenerator,(string *)&out);
  sVar6 = ctlfilename._M_string_length;
  strlen(pcVar10);
  std::__cxx11::string::_M_replace((ulong)&ctlfilename,0,(char *)sVar6,(ulong)pcVar10);
  if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)
      &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1
                   );
  }
  std::__cxx11::string::append((char *)&ctlfilename);
  dirName._M_dataplus._M_p = (pointer)&dirName.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&dirName,"GEN_CPACK_DEBIAN_PACKAGE_NAME","");
  pcVar10 = cmCPackGenerator::GetOption(&local_23c8->super_cmCPackGenerator,&dirName);
  std::__cxx11::string::string((string *)&out,pcVar10,(allocator *)&installDirs);
  cmsys::SystemTools::LowerCase(&debian_pkg_name,(string *)&out);
  if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)
      &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)dirName._M_dataplus._M_p != &dirName.field_2) {
    operator_delete(dirName._M_dataplus._M_p,dirName.field_2._M_allocated_capacity + 1);
  }
  out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&out,"GEN_CPACK_DEBIAN_PACKAGE_VERSION","");
  pcVar10 = cmCPackGenerator::GetOption(&local_23c8->super_cmCPackGenerator,(string *)&out);
  if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)
      &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1
                   );
  }
  out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&out,"GEN_CPACK_DEBIAN_PACKAGE_SECTION","");
  pcVar11 = cmCPackGenerator::GetOption(&local_23c8->super_cmCPackGenerator,(string *)&out);
  if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)
      &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1
                   );
  }
  out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&out,"GEN_CPACK_DEBIAN_PACKAGE_PRIORITY","");
  pcVar12 = cmCPackGenerator::GetOption(&local_23c8->super_cmCPackGenerator,(string *)&out);
  if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)
      &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1
                   );
  }
  out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&out,"GEN_CPACK_DEBIAN_PACKAGE_ARCHITECTURE","");
  __s = cmCPackGenerator::GetOption(&local_23c8->super_cmCPackGenerator,(string *)&out);
  if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)
      &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1
                   );
  }
  out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&out,"GEN_CPACK_DEBIAN_PACKAGE_MAINTAINER","");
  __s_00 = cmCPackGenerator::GetOption(&local_23c8->super_cmCPackGenerator,(string *)&out);
  if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)
      &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1
                   );
  }
  out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&out,"GEN_CPACK_DEBIAN_PACKAGE_DESCRIPTION","");
  __s_01 = cmCPackGenerator::GetOption(&local_23c8->super_cmCPackGenerator,(string *)&out);
  if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)
      &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1
                   );
  }
  out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&out,"GEN_CPACK_DEBIAN_PACKAGE_DEPENDS","");
  __s_02 = cmCPackGenerator::GetOption(&local_23c8->super_cmCPackGenerator,(string *)&out);
  if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)
      &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1
                   );
  }
  out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&out,"GEN_CPACK_DEBIAN_PACKAGE_RECOMMENDS","");
  __s_03 = cmCPackGenerator::GetOption(&local_23c8->super_cmCPackGenerator,(string *)&out);
  if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)
      &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1
                   );
  }
  out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&out,"GEN_CPACK_DEBIAN_PACKAGE_SUGGESTS","");
  __s_04 = cmCPackGenerator::GetOption(&local_23c8->super_cmCPackGenerator,(string *)&out);
  if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)
      &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1
                   );
  }
  out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&out,"GEN_CPACK_DEBIAN_PACKAGE_HOMEPAGE","");
  __s_05 = cmCPackGenerator::GetOption(&local_23c8->super_cmCPackGenerator,(string *)&out);
  if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)
      &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1
                   );
  }
  out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&out,"GEN_CPACK_DEBIAN_PACKAGE_PREDEPENDS","");
  __s_06 = cmCPackGenerator::GetOption(&local_23c8->super_cmCPackGenerator,(string *)&out);
  if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)
      &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1
                   );
  }
  out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&out,"GEN_CPACK_DEBIAN_PACKAGE_ENHANCES","");
  __s_07 = cmCPackGenerator::GetOption(&local_23c8->super_cmCPackGenerator,(string *)&out);
  if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)
      &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1
                   );
  }
  out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&out,"GEN_CPACK_DEBIAN_PACKAGE_BREAKS","");
  __s_08 = cmCPackGenerator::GetOption(&local_23c8->super_cmCPackGenerator,(string *)&out);
  if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)
      &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1
                   );
  }
  out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&out,"GEN_CPACK_DEBIAN_PACKAGE_CONFLICTS","");
  __s_09 = cmCPackGenerator::GetOption(&local_23c8->super_cmCPackGenerator,(string *)&out);
  if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)
      &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1
                   );
  }
  out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&out,"GEN_CPACK_DEBIAN_PACKAGE_PROVIDES","");
  __s_10 = cmCPackGenerator::GetOption(&local_23c8->super_cmCPackGenerator,(string *)&out);
  if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)
      &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1
                   );
  }
  out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&out,"GEN_CPACK_DEBIAN_PACKAGE_REPLACES","");
  __s_11 = cmCPackGenerator::GetOption(&local_23c8->super_cmCPackGenerator,(string *)&out);
  if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)
      &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1
                   );
  }
  cmGeneratedFileStream::cmGeneratedFileStream(&out,ctlfilename._M_dataplus._M_p,false);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"Package: ",9);
  poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&out,debian_pkg_name._M_dataplus._M_p,
                       debian_pkg_name._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"Version: ",9);
  if (pcVar10 == (char *)0x0) {
    std::ios::clear((int)&local_23c8 +
                    (int)out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                         _vptr_basic_ostream[-3] + 0x390);
  }
  else {
    sVar14 = strlen(pcVar10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,pcVar10,sVar14);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"Section: ",9);
  if (pcVar11 == (char *)0x0) {
    std::ios::clear((int)&local_23c8 +
                    (int)out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                         _vptr_basic_ostream[-3] + 0x390);
  }
  else {
    sVar14 = strlen(pcVar11);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,pcVar11,sVar14);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"Priority: ",10);
  if (pcVar12 == (char *)0x0) {
    std::ios::clear((int)&local_23c8 +
                    (int)out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                         _vptr_basic_ostream[-3] + 0x390);
  }
  else {
    sVar14 = strlen(pcVar12);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,pcVar12,sVar14);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"Architecture: ",0xe);
  if (__s == (char *)0x0) {
    std::ios::clear((int)&local_23c8 +
                    (int)out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                         _vptr_basic_ostream[-3] + 0x390);
  }
  else {
    sVar14 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,__s,sVar14);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"\n",1);
  if ((__s_02 != (char *)0x0) && (*__s_02 != '\0')) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"Depends: ",9);
    sVar14 = strlen(__s_02);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,__s_02,sVar14);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"\n",1);
  }
  if ((__s_03 != (char *)0x0) && (*__s_03 != '\0')) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"Recommends: ",0xc);
    sVar14 = strlen(__s_03);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,__s_03,sVar14);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"\n",1);
  }
  if ((__s_04 != (char *)0x0) && (*__s_04 != '\0')) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"Suggests: ",10);
    sVar14 = strlen(__s_04);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,__s_04,sVar14);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"\n",1);
  }
  if ((__s_05 != (char *)0x0) && (*__s_05 != '\0')) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"Homepage: ",10);
    sVar14 = strlen(__s_05);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,__s_05,sVar14);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"\n",1);
  }
  if ((__s_06 != (char *)0x0) && (*__s_06 != '\0')) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"Pre-Depends: ",0xd);
    sVar14 = strlen(__s_06);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,__s_06,sVar14);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"\n",1);
  }
  if ((__s_07 != (char *)0x0) && (*__s_07 != '\0')) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"Enhances: ",10);
    sVar14 = strlen(__s_07);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,__s_07,sVar14);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"\n",1);
  }
  if ((__s_08 != (char *)0x0) && (*__s_08 != '\0')) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"Breaks: ",8);
    sVar14 = strlen(__s_08);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,__s_08,sVar14);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"\n",1);
  }
  if ((__s_09 != (char *)0x0) && (*__s_09 != '\0')) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"Conflicts: ",0xb);
    sVar14 = strlen(__s_09);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,__s_09,sVar14);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"\n",1);
  }
  if ((__s_10 != (char *)0x0) && (*__s_10 != '\0')) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"Provides: ",10);
    sVar14 = strlen(__s_10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,__s_10,sVar14);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"\n",1);
  }
  if ((__s_11 != (char *)0x0) && (*__s_11 != '\0')) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"Replaces: ",10);
    sVar14 = strlen(__s_11);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,__s_11,sVar14);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"\n",1);
  }
  pp_Var1 = &installDirs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  installDirs._M_t._M_impl._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&installDirs,"CPACK_TEMPORARY_DIRECTORY","");
  pcVar10 = cmCPackGenerator::GetOption(&local_23c8->super_cmCPackGenerator,(string *)&installDirs);
  std::__cxx11::string::string((string *)&dirName,pcVar10,(allocator *)&cmd);
  if ((_Base_ptr *)installDirs._M_t._M_impl._0_8_ != pp_Var1) {
    operator_delete((void *)installDirs._M_t._M_impl._0_8_,
                    (ulong)((long)&(installDirs._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  std::__cxx11::string::push_back((char)&dirName);
  pbVar24 = (local_23c8->packageFiles).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (pbVar24 !=
      (local_23c8->packageFiles).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      cmsys::SystemTools::FileLength(pbVar24);
      pbVar24 = pbVar24 + 1;
    } while (pbVar24 !=
             (local_23c8->packageFiles).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)dirName._M_dataplus._M_p != &dirName.field_2) {
    operator_delete(dirName._M_dataplus._M_p,dirName.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"Installed-Size: ",0x10);
  poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)&out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"Maintainer: ",0xc);
  if (__s_00 == (char *)0x0) {
    std::ios::clear((int)&local_23c8 +
                    (int)out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                         _vptr_basic_ostream[-3] + 0x390);
  }
  else {
    sVar14 = strlen(__s_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,__s_00,sVar14);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"Description: ",0xd);
  if (__s_01 == (char *)0x0) {
    std::ios::clear((int)&local_23c8 +
                    (int)out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                         _vptr_basic_ostream[-3] + 0x390);
  }
  else {
    sVar14 = strlen(__s_01);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,__s_01,sVar14);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"\n",1);
  std::ios::widen((char)&out +
                  (char)out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                        _vptr_basic_ostream[-3]);
  std::ostream::put((char)&out);
  std::ostream::flush();
  cmGeneratedFileStream::~cmGeneratedFileStream(&out);
  out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&out,"GEN_CPACK_DEBIAN_FAKEROOT_EXECUTABLE","");
  pcVar10 = cmCPackGenerator::GetOption(&local_23c8->super_cmCPackGenerator,(string *)&out);
  std::__cxx11::string::string((string *)&cmd,pcVar10,(allocator *)&dirName);
  if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)
      &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1
                   );
  }
  out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&out,"GEN_CPACK_DEBIAN_COMPRESSION_TYPE","");
  pcVar10 = cmCPackGenerator::GetOption(&local_23c8->super_cmCPackGenerator,(string *)&out);
  if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)
      &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1
                   );
  }
  pcVar11 = "gzip";
  if (pcVar10 != (char *)0x0) {
    pcVar11 = pcVar10;
  }
  cmake_tar._M_dataplus._M_p = (pointer)&cmake_tar.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&cmake_tar," ","");
  compression_modifier._M_dataplus._M_p = (pointer)&compression_modifier.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&compression_modifier,"a","");
  compression_suffix._M_dataplus._M_p = (pointer)&compression_suffix.field_2;
  compression_suffix._M_string_length = 0;
  compression_suffix.field_2._M_local_buf[0] = '\0';
  iVar9 = strcmp(pcVar11,"lzma");
  if (iVar9 == 0) {
    pcVar10 = ".lzma";
LAB_00253b68:
    std::__cxx11::string::_M_replace((ulong)&compression_suffix,0,(char *)0x0,(ulong)pcVar10);
  }
  else {
    if (((*pcVar11 == 'x') && (pcVar11[1] == 'z')) && (pcVar11[2] == '\0')) {
      pcVar10 = ".xz";
      goto LAB_00253b68;
    }
    iVar9 = strcmp(pcVar11,"bzip2");
    if (iVar9 == 0) {
      std::__cxx11::string::_M_replace((ulong)&compression_suffix,0,(char *)0x0,0x4eb2db);
      std::__cxx11::string::_M_replace
                ((ulong)&compression_modifier,0,(char *)compression_modifier._M_string_length,
                 0x4fb4ec);
      psVar17 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
      std::operator+(&dirName,"\"",psVar17);
      plVar15 = (long *)std::__cxx11::string::append((char *)&dirName);
      out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
           (_func_int **)
           &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
      pp_Var20 = (_func_int **)(plVar15 + 2);
      if ((_func_int **)*plVar15 == pp_Var20) {
        out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var20;
        out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = plVar15[3];
      }
      else {
        out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var20;
        out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
             (_func_int **)*plVar15;
      }
      out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = plVar15[1];
      *plVar15 = (long)pp_Var20;
      plVar15[1] = 0;
      *(undefined1 *)(plVar15 + 2) = 0;
      std::__cxx11::string::_M_append
                ((char *)&cmake_tar,
                 (ulong)out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                        _vptr_basic_ostream);
LAB_00253e46:
      if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
          != (_func_int **)
             &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
        operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                        _vptr_basic_ostream,
                        out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_
                        + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)dirName._M_dataplus._M_p != &dirName.field_2) {
        operator_delete(dirName._M_dataplus._M_p,dirName.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      iVar9 = strcmp(pcVar11,"gzip");
      if (iVar9 == 0) {
        std::__cxx11::string::_M_replace((ulong)&compression_suffix,0,(char *)0x0,0x4f1e64);
        std::__cxx11::string::_M_replace
                  ((ulong)&compression_modifier,0,(char *)compression_modifier._M_string_length,
                   0x4eb37b);
        psVar17 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
        std::operator+(&dirName,"\"",psVar17);
        plVar15 = (long *)std::__cxx11::string::append((char *)&dirName);
        out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
             (_func_int **)
             &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
        pp_Var20 = (_func_int **)(plVar15 + 2);
        if ((_func_int **)*plVar15 == pp_Var20) {
          out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var20;
          out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = plVar15[3];
        }
        else {
          out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var20;
          out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
               = (_func_int **)*plVar15;
        }
        out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = plVar15[1];
        *plVar15 = (long)pp_Var20;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        std::__cxx11::string::_M_append
                  ((char *)&cmake_tar,
                   (ulong)out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                          _vptr_basic_ostream);
        goto LAB_00253e46;
      }
      iVar9 = strcmp(pcVar11,"none");
      if (iVar9 == 0) {
        std::__cxx11::string::_M_replace((ulong)&compression_suffix,0,(char *)0x0,0x53a539);
        std::__cxx11::string::_M_replace
                  ((ulong)&compression_modifier,0,(char *)compression_modifier._M_string_length,
                   0x53a539);
        psVar17 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
        std::operator+(&dirName,"\"",psVar17);
        plVar15 = (long *)std::__cxx11::string::append((char *)&dirName);
        out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
             (_func_int **)
             &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
        pp_Var20 = (_func_int **)(plVar15 + 2);
        if ((_func_int **)*plVar15 == pp_Var20) {
          out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var20;
          out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = plVar15[3];
        }
        else {
          out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var20;
          out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
               = (_func_int **)*plVar15;
        }
        out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = plVar15[1];
        *plVar15 = (long)pp_Var20;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        std::__cxx11::string::_M_append
                  ((char *)&cmake_tar,
                   (ulong)out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                          _vptr_basic_ostream);
        goto LAB_00253e46;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&out);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&out,"Error unrecognized compression type: ",0x25);
      sVar14 = strlen(pcVar11);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,pcVar11,sVar14);
      std::ios::widen((char)&out +
                      (char)out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                            _vptr_basic_ostream[-3]);
      std::ostream::put((char)&out);
      std::ostream::flush();
      pcVar2 = (local_23c8->super_cmCPackGenerator).Logger;
      std::__cxx11::stringbuf::str();
      _Var23 = dirName._M_dataplus;
      sVar14 = strlen(dirName._M_dataplus._M_p);
      cmCPackLog::Log(pcVar2,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                      ,0x1b1,_Var23._M_p,sVar14);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)dirName._M_dataplus._M_p != &dirName.field_2) {
        operator_delete(dirName._M_dataplus._M_p,dirName.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&out);
      std::ios_base::~ios_base
                ((ios_base *)
                 &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
    }
  }
  output._M_dataplus._M_p = (pointer)&output.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&output,cmake_tar._M_dataplus._M_p,
             cmake_tar._M_dataplus._M_p + cmake_tar._M_string_length);
  std::__cxx11::string::append((char *)&output);
  plVar15 = (long *)std::__cxx11::string::_M_append
                              ((char *)&output,(ulong)compression_modifier._M_dataplus._M_p);
  plVar21 = plVar15 + 2;
  if ((long *)*plVar15 == plVar21) {
    installDirs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar21;
    installDirs._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)plVar15[3];
    installDirs._M_t._M_impl._0_8_ = pp_Var1;
  }
  else {
    installDirs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar21;
    installDirs._M_t._M_impl._0_8_ = (long *)*plVar15;
  }
  installDirs._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar15[1];
  *plVar15 = (long)plVar21;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  plVar15 = (long *)std::__cxx11::string::append((char *)&installDirs);
  dirName._M_dataplus._M_p = (pointer)&dirName.field_2;
  psVar22 = (size_type *)(plVar15 + 2);
  if ((size_type *)*plVar15 == psVar22) {
    dirName.field_2._M_allocated_capacity = *psVar22;
    dirName.field_2._8_8_ = plVar15[3];
  }
  else {
    dirName.field_2._M_allocated_capacity = *psVar22;
    dirName._M_dataplus._M_p = (pointer)*plVar15;
  }
  dirName._M_string_length = plVar15[1];
  *plVar15 = (long)psVar22;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  plVar15 = (long *)std::__cxx11::string::_M_append
                              ((char *)&dirName,(ulong)compression_suffix._M_dataplus._M_p);
  out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  pp_Var20 = (_func_int **)(plVar15 + 2);
  if ((_func_int **)*plVar15 == pp_Var20) {
    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var20;
    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = plVar15[3];
  }
  else {
    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var20;
    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)*plVar15;
  }
  out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = plVar15[1];
  *plVar15 = (long)pp_Var20;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  std::__cxx11::string::_M_append
            ((char *)&cmd,
             (ulong)out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream);
  if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)
      &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)dirName._M_dataplus._M_p != &dirName.field_2) {
    operator_delete(dirName._M_dataplus._M_p,dirName.field_2._M_allocated_capacity + 1);
  }
  if ((_Base_ptr *)installDirs._M_t._M_impl._0_8_ != pp_Var1) {
    operator_delete((void *)installDirs._M_t._M_impl._0_8_,
                    (ulong)((long)&(installDirs._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)output._M_dataplus._M_p != &output.field_2) {
    operator_delete(output._M_dataplus._M_p,
                    CONCAT71(output.field_2._M_allocated_capacity._1_7_,
                             output.field_2._M_local_buf[0]) + 1);
  }
  dirName._M_dataplus._M_p = (pointer)&dirName.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&dirName,"GEN_WDIR","");
  pcVar10 = cmCPackGenerator::GetOption(&local_23c8->super_cmCPackGenerator,&dirName);
  std::__cxx11::string::string((string *)&out,pcVar10,(allocator *)&installDirs);
  if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)
      &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)dirName._M_dataplus._M_p != &dirName.field_2) {
    operator_delete(dirName._M_dataplus._M_p,dirName.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&out);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"WDIR: \"",7);
  dirName._M_dataplus._M_p = (pointer)&dirName.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&dirName,"GEN_WDIR","");
  pcVar10 = cmCPackGenerator::GetOption(&local_23c8->super_cmCPackGenerator,&dirName);
  if (pcVar10 == (char *)0x0) {
    std::ios::clear((int)&local_23c8 +
                    (int)out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                         _vptr_basic_ostream[-3] + 0x390);
  }
  else {
    sVar14 = strlen(pcVar10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,pcVar10,sVar14);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"\", length = ",0xc);
  poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)&out);
  std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
  std::ostream::put((char)poVar13);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)dirName._M_dataplus._M_p != &dirName.field_2) {
    operator_delete(dirName._M_dataplus._M_p,dirName.field_2._M_allocated_capacity + 1);
  }
  pcVar2 = (local_23c8->super_cmCPackGenerator).Logger;
  std::__cxx11::stringbuf::str();
  _Var23 = dirName._M_dataplus;
  sVar14 = strlen(dirName._M_dataplus._M_p);
  cmCPackLog::Log(pcVar2,4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                  ,0x1be,_Var23._M_p,sVar14);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)dirName._M_dataplus._M_p != &dirName.field_2) {
    operator_delete(dirName._M_dataplus._M_p,dirName.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&out);
  std::ios_base::~ios_base
            ((ios_base *)
             &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
  installDirs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &installDirs._M_t._M_impl.super__Rb_tree_header._M_header;
  installDirs._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       installDirs._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  installDirs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  installDirs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pbVar24 = (local_23c8->packageFiles).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  installDirs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       installDirs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (pbVar24 !=
      (local_23c8->packageFiles).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&out);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"FILEIT: \"",9);
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&out,(pbVar24->_M_dataplus)._M_p,pbVar24->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\"",1);
      std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
      std::ostream::put((char)poVar13);
      std::ostream::flush();
      pcVar2 = (local_23c8->super_cmCPackGenerator).Logger;
      std::__cxx11::stringbuf::str();
      _Var23 = dirName._M_dataplus;
      sVar14 = strlen(dirName._M_dataplus._M_p);
      cmCPackLog::Log(pcVar2,4,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                      ,0x1c5,_Var23._M_p,sVar14);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)dirName._M_dataplus._M_p != &dirName.field_2) {
        operator_delete(dirName._M_dataplus._M_p,dirName.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&out);
      std::ios_base::~ios_base
                ((ios_base *)
                 &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
      std::__cxx11::string::find((char)pbVar24,0x2f);
      std::__cxx11::string::substr((ulong)&dirName,(ulong)pbVar24);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&out);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"RELATIVEDIR: \"",0xe);
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&out,dirName._M_dataplus._M_p,dirName._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\"",1);
      std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
      std::ostream::put((char)poVar13);
      std::ostream::flush();
      pcVar2 = (local_23c8->super_cmCPackGenerator).Logger;
      std::__cxx11::stringbuf::str();
      _Var23 = output._M_dataplus;
      sVar14 = strlen(output._M_dataplus._M_p);
      cmCPackLog::Log(pcVar2,4,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                      ,0x1ca,_Var23._M_p,sVar14);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)output._M_dataplus._M_p != &output.field_2) {
        operator_delete(output._M_dataplus._M_p,
                        CONCAT71(output.field_2._M_allocated_capacity._1_7_,
                                 output.field_2._M_local_buf[0]) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&out);
      std::ios_base::~ios_base
                ((ios_base *)
                 &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
      iVar16 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find(&installDirs._M_t,&dirName);
      if ((_Rb_tree_header *)iVar16._M_node == &installDirs._M_t._M_impl.super__Rb_tree_header) {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&installDirs,&dirName);
        std::__cxx11::string::append((char *)&cmd);
        std::__cxx11::string::_M_append((char *)&cmd,(ulong)dirName._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)dirName._M_dataplus._M_p != &dirName.field_2) {
        operator_delete(dirName._M_dataplus._M_p,dirName.field_2._M_allocated_capacity + 1);
      }
      pbVar24 = pbVar24 + 1;
    } while (pbVar24 !=
             (local_23c8->packageFiles).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  _Var23._M_p = cmd._M_dataplus._M_p;
  output._M_dataplus._M_p = (pointer)&output.field_2;
  output._M_string_length = 0;
  output.field_2._M_local_buf[0] = '\0';
  retval = -1;
  out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&out,"GEN_WDIR","");
  pcVar5 = local_23c8;
  pcVar10 = cmCPackGenerator::GetOption(&local_23c8->super_cmCPackGenerator,(string *)&out);
  bVar8 = cmSystemTools::RunSingleCommand
                    (_Var23._M_p,&output,&output,&retval,pcVar10,
                     (pcVar5->super_cmCPackGenerator).GeneratorVerbose,0.0);
  if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)
      &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1
                   );
  }
  if (!bVar8 || retval != 0) {
    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)
         &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)&out,"CPACK_TOPLEVEL_DIRECTORY","");
    pcVar10 = cmCPackGenerator::GetOption(&local_23c8->super_cmCPackGenerator,(string *)&out);
    std::__cxx11::string::string((string *)&md5filename,pcVar10,(allocator *)&dirName);
    if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
        (_func_int **)
        &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
      operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                      _vptr_basic_ostream,
                      out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ +
                      1);
    }
    std::__cxx11::string::append((char *)&md5filename);
    cmGeneratedFileStream::cmGeneratedFileStream(&out,md5filename._M_dataplus._M_p,false);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"# Run command: ",0xf);
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&out,cmd._M_dataplus._M_p,cmd._M_string_length);
    std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
    std::ostream::put((char)poVar13);
    poVar13 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"# Working directory: ",0x15);
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar13,(local_23c8->super_cmCPackGenerator).toplevel._M_dataplus._M_p,
                         (local_23c8->super_cmCPackGenerator).toplevel._M_string_length);
    std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
    std::ostream::put((char)poVar13);
    poVar13 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"# Output:",9);
    std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
    std::ostream::put((char)poVar13);
    poVar13 = (ostream *)std::ostream::flush();
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar13,output._M_dataplus._M_p,output._M_string_length);
    std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
    std::ostream::put((char)poVar13);
    std::ostream::flush();
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dirName);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&dirName,"Problem running tar command: ",0x1d);
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&dirName,cmd._M_dataplus._M_p,cmd._M_string_length);
    std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
    std::ostream::put((char)poVar13);
    poVar13 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"Please check ",0xd);
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar13,md5filename._M_dataplus._M_p,md5filename._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13," for errors",0xb);
    std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
    std::ostream::put((char)poVar13);
    std::ostream::flush();
    pcVar2 = (local_23c8->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    _Var23 = topLevelString._M_dataplus;
    sVar14 = strlen(topLevelString._M_dataplus._M_p);
    cmCPackLog::Log(pcVar2,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                    ,0x1e3,_Var23._M_p,sVar14);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)topLevelString._M_dataplus._M_p != &topLevelString.field_2) {
      operator_delete(topLevelString._M_dataplus._M_p,
                      topLevelString.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dirName);
    std::ios_base::~ios_base(local_2200);
    cmGeneratedFileStream::~cmGeneratedFileStream(&out);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)md5filename._M_dataplus._M_p != &md5filename.field_2) {
      operator_delete(md5filename._M_dataplus._M_p,
                      CONCAT71(md5filename.field_2._M_allocated_capacity._1_7_,
                               md5filename.field_2._M_local_buf[0]) + 1);
    }
    iVar9 = 0;
    goto LAB_00255dc5;
  }
  md5filename._M_dataplus._M_p = (pointer)&md5filename.field_2;
  md5filename._M_string_length = 0;
  md5filename.field_2._M_local_buf[0] = '\0';
  out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&out,"GEN_WDIR","");
  pcVar10 = cmCPackGenerator::GetOption(&local_23c8->super_cmCPackGenerator,(string *)&out);
  sVar6 = md5filename._M_string_length;
  strlen(pcVar10);
  std::__cxx11::string::_M_replace((ulong)&md5filename,0,(char *)sVar6,(ulong)pcVar10);
  if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)
      &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1
                   );
  }
  std::__cxx11::string::append((char *)&md5filename);
  cmGeneratedFileStream::cmGeneratedFileStream(&out,md5filename._M_dataplus._M_p,false);
  dirName._M_dataplus._M_p = (pointer)&dirName.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&dirName,"CPACK_TEMPORARY_DIRECTORY","")
  ;
  pcVar10 = cmCPackGenerator::GetOption(&local_23c8->super_cmCPackGenerator,&dirName);
  std::__cxx11::string::string((string *)&topLevelString,pcVar10,(allocator *)&outputFileName);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)dirName._M_dataplus._M_p != &dirName.field_2) {
    operator_delete(dirName._M_dataplus._M_p,dirName.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::push_back((char)&topLevelString);
  pbVar24 = (local_23c8->packageFiles).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (pbVar24 !=
      (local_23c8->packageFiles).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      std::__cxx11::string::_M_replace((ulong)&cmd,0,(char *)cmd._M_string_length,0x52973c);
      psVar17 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
      std::__cxx11::string::_M_append((char *)&cmd,(ulong)(psVar17->_M_dataplus)._M_p);
      std::__cxx11::string::append((char *)&cmd);
      std::__cxx11::string::_M_append((char *)&cmd,(ulong)(pbVar24->_M_dataplus)._M_p);
      std::__cxx11::string::append((char *)&cmd);
      bVar8 = cmSystemTools::RunSingleCommand
                        (cmd._M_dataplus._M_p,&output,&output,&retval,
                         (local_23c8->super_cmCPackGenerator).toplevel._M_dataplus._M_p,
                         (local_23c8->super_cmCPackGenerator).GeneratorVerbose,0.0);
      if (!bVar8 || retval != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&dirName);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&dirName,"Problem running cmake -E md5sum ",0x20);
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&dirName,cmd._M_dataplus._M_p,cmd._M_string_length);
        std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
        std::ostream::put((char)poVar13);
        std::ostream::flush();
        pcVar2 = (local_23c8->super_cmCPackGenerator).Logger;
        std::__cxx11::stringbuf::str();
        _Var23 = outputFileName._M_dataplus;
        sVar14 = strlen(outputFileName._M_dataplus._M_p);
        cmCPackLog::Log(pcVar2,0x10,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                        ,0x201,_Var23._M_p,sVar14);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)outputFileName._M_dataplus._M_p != &outputFileName.field_2) {
          operator_delete(outputFileName._M_dataplus._M_p,
                          outputFileName.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dirName);
        std::ios_base::~ios_base(local_2200);
      }
      cmsys::SystemTools::ReplaceString(&output,topLevelString._M_dataplus._M_p,"");
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&out,output._M_dataplus._M_p,output._M_string_length);
      pbVar24 = pbVar24 + 1;
    } while (pbVar24 !=
             (local_23c8->packageFiles).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)topLevelString._M_dataplus._M_p != &topLevelString.field_2) {
    operator_delete(topLevelString._M_dataplus._M_p,topLevelString.field_2._M_allocated_capacity + 1
                   );
  }
  cmGeneratedFileStream::~cmGeneratedFileStream(&out);
  cmsys::SystemTools::SetPermissions(md5filename._M_dataplus._M_p,0x1a4);
  out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&out,"GEN_CPACK_DEBIAN_FAKEROOT_EXECUTABLE","");
  pcVar10 = cmCPackGenerator::GetOption(&local_23c8->super_cmCPackGenerator,(string *)&out);
  sVar6 = cmd._M_string_length;
  strlen(pcVar10);
  std::__cxx11::string::_M_replace((ulong)&cmd,0,(char *)sVar6,(ulong)pcVar10);
  if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)
      &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1
                   );
  }
  out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&out,cmake_tar._M_dataplus._M_p,
             cmake_tar._M_dataplus._M_p + cmake_tar._M_string_length);
  std::__cxx11::string::append((char *)&out);
  std::__cxx11::string::_M_append
            ((char *)&cmd,
             (ulong)out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream);
  if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)
      &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1
                   );
  }
  out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&out,"GEN_CPACK_DEBIAN_PACKAGE_CONTROL_EXTRA","");
  pcVar10 = cmCPackGenerator::GetOption(&local_23c8->super_cmCPackGenerator,(string *)&out);
  if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)
      &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1
                   );
  }
  if (pcVar10 != (char *)0x0) {
    outputFileName._M_dataplus._M_p = (pointer)0x0;
    outputFileName._M_string_length = 0;
    outputFileName.field_2._M_allocated_capacity = 0;
    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)
         &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
    sVar14 = strlen(pcVar10);
    std::__cxx11::string::_M_construct<char_const*>((string *)&out,pcVar10,pcVar10 + sVar14);
    cmSystemTools::ExpandListArgument
              ((string *)&out,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&outputFileName,false);
    if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
        (_func_int **)
        &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
      operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                      _vptr_basic_ostream,
                      out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ +
                      1);
    }
    if (outputFileName._M_dataplus._M_p != (pointer)outputFileName._M_string_length) {
      _Var23._M_p = outputFileName._M_dataplus._M_p;
      do {
        cmsys::SystemTools::GetFilenameName((string *)&out,(string *)_Var23._M_p);
        topLevelString._M_dataplus._M_p = (pointer)&topLevelString.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&topLevelString,"GEN_WDIR","");
        pcVar10 = cmCPackGenerator::GetOption(&local_23c8->super_cmCPackGenerator,&topLevelString);
        std::__cxx11::string::string((string *)&dirName,pcVar10,(allocator *)&arFiles);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)topLevelString._M_dataplus._M_p != &topLevelString.field_2) {
          operator_delete(topLevelString._M_dataplus._M_p,
                          topLevelString.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::append((char *)&dirName);
        std::__cxx11::string::_M_append
                  ((char *)&dirName,
                   (ulong)out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                          _vptr_basic_ostream);
        bVar8 = cmsys::SystemTools::CopyFileIfDifferent((string *)_Var23._M_p,&dirName);
        if (bVar8) {
          std::__cxx11::string::append((char *)&cmd);
          std::__cxx11::string::_M_append
                    ((char *)&cmd,
                     (ulong)out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                            _vptr_basic_ostream);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)dirName._M_dataplus._M_p != &dirName.field_2) {
          operator_delete(dirName._M_dataplus._M_p,dirName.field_2._M_allocated_capacity + 1);
        }
        if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
            _vptr_basic_ostream !=
            (_func_int **)
            &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
          operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                          _vptr_basic_ostream,
                          out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                          _16_8_ + 1);
        }
        _Var23._M_p = _Var23._M_p + 0x20;
      } while (_Var23._M_p != (pointer)outputFileName._M_string_length);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&outputFileName);
  }
  _Var23._M_p = cmd._M_dataplus._M_p;
  out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&out,"GEN_WDIR","");
  pcVar5 = local_23c8;
  pcVar10 = cmCPackGenerator::GetOption(&local_23c8->super_cmCPackGenerator,(string *)&out);
  bVar8 = cmSystemTools::RunSingleCommand
                    (_Var23._M_p,&output,&output,&retval,pcVar10,
                     (pcVar5->super_cmCPackGenerator).GeneratorVerbose,0.0);
  if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)
      &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1
                   );
  }
  if (bVar8 && retval == 0) {
    arFiles.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    arFiles.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    arFiles.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)
         &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)&out,"GEN_WDIR","");
    pcVar10 = cmCPackGenerator::GetOption(&local_23c8->super_cmCPackGenerator,(string *)&out);
    std::__cxx11::string::string((string *)&topLevelString,pcVar10,(allocator *)&dirName);
    if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
        (_func_int **)
        &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
      operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                      _vptr_basic_ostream,
                      out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ +
                      1);
    }
    std::__cxx11::string::append((char *)&topLevelString);
    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)
         &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&out,topLevelString._M_dataplus._M_p,
               topLevelString._M_dataplus._M_p + topLevelString._M_string_length);
    std::__cxx11::string::append((char *)&out);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&arFiles,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out);
    if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
        (_func_int **)
        &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
      operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                      _vptr_basic_ostream,
                      out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ +
                      1);
    }
    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)
         &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&out,topLevelString._M_dataplus._M_p,
               topLevelString._M_dataplus._M_p + topLevelString._M_string_length);
    std::__cxx11::string::append((char *)&out);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&arFiles,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out);
    if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
        (_func_int **)
        &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
      operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                      _vptr_basic_ostream,
                      out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ +
                      1);
    }
    dirName._M_dataplus._M_p = (pointer)&dirName.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&dirName,topLevelString._M_dataplus._M_p,
               topLevelString._M_dataplus._M_p + topLevelString._M_string_length);
    std::__cxx11::string::append((char *)&dirName);
    plVar15 = (long *)std::__cxx11::string::_M_append
                                ((char *)&dirName,(ulong)compression_suffix._M_dataplus._M_p);
    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)
         &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
    pp_Var20 = (_func_int **)(plVar15 + 2);
    if ((_func_int **)*plVar15 == pp_Var20) {
      out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var20;
      out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = plVar15[3];
    }
    else {
      out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var20;
      out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
           (_func_int **)*plVar15;
    }
    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = plVar15[1];
    *plVar15 = (long)pp_Var20;
    plVar15[1] = 0;
    *(undefined1 *)(plVar15 + 2) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&arFiles,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out);
    if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
        (_func_int **)
        &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
      operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                      _vptr_basic_ostream,
                      out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ +
                      1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)dirName._M_dataplus._M_p != &dirName.field_2) {
      operator_delete(dirName._M_dataplus._M_p,dirName.field_2._M_allocated_capacity + 1);
    }
    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)
         &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)&out,"CPACK_TOPLEVEL_DIRECTORY","");
    pcVar10 = cmCPackGenerator::GetOption(&local_23c8->super_cmCPackGenerator,(string *)&out);
    std::__cxx11::string::string((string *)&outputFileName,pcVar10,(allocator *)&dirName);
    if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
        (_func_int **)
        &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
      operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                      _vptr_basic_ostream,
                      out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ +
                      1);
    }
    std::__cxx11::string::append((char *)&outputFileName);
    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)
         &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)&out,"CPACK_OUTPUT_FILE_NAME","");
    cmCPackGenerator::GetOption(&local_23c8->super_cmCPackGenerator,(string *)&out);
    std::__cxx11::string::append((char *)&outputFileName);
    if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
        (_func_int **)
        &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
      operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                      _vptr_basic_ostream,
                      out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ +
                      1);
    }
    std::__cxx11::string::string
              ((string *)&out,outputFileName._M_dataplus._M_p,(allocator *)&dirName);
    __s_12 = (FILE *)cmsys::SystemTools::Fopen((string *)&out,"wb+");
    if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
        (_func_int **)
        &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
      operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                      _vptr_basic_ostream,
                      out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ +
                      1);
    }
    if (__s_12 == (FILE *)0x0) {
      iVar9 = -4;
LAB_00255c2f:
      out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
           (_func_int **)
           &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&out,"CPACK_TEMPORARY_PACKAGE_FILE_NAME","");
      pcVar10 = cmCPackGenerator::GetOption(&local_23c8->super_cmCPackGenerator,(string *)&out);
      std::__cxx11::string::string((string *)&dirName,pcVar10,&local_23b9);
      if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
          != (_func_int **)
             &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
        operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                        _vptr_basic_ostream,
                        out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_
                        + 1);
      }
      std::__cxx11::string::append((char *)&dirName);
      cmGeneratedFileStream::cmGeneratedFileStream(&out,dirName._M_dataplus._M_p,false);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&out,"# Problem creating archive using: ",0x22);
      plVar15 = (long *)std::ostream::operator<<(&out,iVar9);
      std::ios::widen((char)*(undefined8 *)(*plVar15 + -0x18) + (char)plVar15);
      std::ostream::put((char)plVar15);
      std::ostream::flush();
      cmGeneratedFileStream::~cmGeneratedFileStream(&out);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)dirName._M_dataplus._M_p != &dirName.field_2) {
        operator_delete(dirName._M_dataplus._M_p,dirName.field_2._M_allocated_capacity + 1);
      }
      iVar9 = 0;
    }
    else {
      fwrite("!<arch>\n",8,1,__s_12);
      iVar9 = fseek(__s_12,0,2);
      if (iVar9 == -1) {
        iVar9 = -3;
LAB_00255c27:
        fclose(__s_12);
        goto LAB_00255c2f;
      }
      if (arFiles.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          arFiles.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        fclose(__s_12);
      }
      else {
        iVar9 = 0;
        pbVar24 = arFiles.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          pcVar10 = (pbVar24->_M_dataplus)._M_p;
          std::__cxx11::string::string((string *)&out,pcVar10,&local_23b9);
          __stream = (FILE *)cmsys::SystemTools::Fopen((string *)&out,"rb");
          if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
              _vptr_basic_ostream !=
              (_func_int **)
              &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
            operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                            _vptr_basic_ostream,
                            out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                            _16_8_ + 1);
          }
          if (__stream != (FILE *)0x0) {
            pcVar12 = strrchr(pcVar10,0x2f);
            pcVar11 = pcVar12 + 1;
            if (pcVar12 == (char *)0x0) {
              pcVar11 = pcVar10;
            }
            stat64(pcVar10,(stat64 *)&dirName);
            sVar14 = strlen(pcVar11);
            uVar3 = dirName.field_2._12_4_;
            if (0xfffe < (uint)dirName.field_2._12_4_) {
              uVar3 = 0xffff;
            }
            uVar4 = local_2250;
            if (0xfffe < local_2250) {
              uVar4 = 0xffff;
            }
            if ((sVar14 < 0x11) && (pcVar10 = strchr(pcVar11,0x20), pcVar10 == (char *)0x0)) {
              sprintf(ar_hb,"%-16.16s%-12ld%-6u%-6u%-8o%-10lld%2s",pcVar11,local_2218,
                      (ulong)(uint)uVar3,(ulong)uVar4,dirName.field_2._8_8_ & 0xffffffff,local_2240,
                      "`\n");
              sVar14 = fwrite(ar_hb,1,0x3c,__s_12);
              sVar7 = ar_already_written;
              if (sVar14 == 0x3c) {
LAB_00255b05:
                ar_already_written = sVar7;
                sVar14 = local_2240;
                if (local_2240 != 0) {
                  do {
                    sVar18 = 0x2000;
                    if ((long)sVar14 < 0x2000) {
                      sVar18 = sVar14;
                    }
                    sVar18 = fread(&out,1,sVar18,__stream);
                    if (sVar18 == 0) goto LAB_00255c0d;
                    sVar14 = sVar14 - sVar18;
                    uVar25 = 0;
                    do {
                      sVar19 = fwrite((void *)((long)&out.super_ofstream.
                                                                                                            
                                                  super_basic_ostream<char,_std::char_traits<char>_>
                                                  ._vptr_basic_ostream + uVar25),1,sVar18,__s_12);
                      if (sVar19 < sVar18) goto LAB_00255c0d;
                      sVar18 = sVar18 - uVar25;
                      uVar25 = uVar25 + sVar19;
                    } while (uVar25 < sVar18);
                  } while (sVar14 != 0);
                  if ((((int)local_2240 + (int)ar_already_written & 1U) != 0) &&
                     (sVar14 = fwrite(&copy_ar(CF*,long)::pad,1,1,__s_12), sVar14 != 1)) {
LAB_00255c0d:
                    ar_already_written = 0;
                    goto LAB_00255c18;
                  }
                }
                ar_already_written = 0;
                fclose(__stream);
                goto LAB_00255bdc;
              }
            }
            else {
              sprintf(ar_hb,"%s%-13d%-12ld%-6u%-6u%-8o%-10lld%2s","#1/",sVar14 & 0xffffffff,
                      local_2218,(ulong)(uint)uVar3,(ulong)uVar4,dirName.field_2._8_8_ & 0xffffffff,
                      local_2240 + sVar14,"`\n");
              sVar18 = fwrite(ar_hb,1,0x3c,__s_12);
              if ((sVar18 == 0x3c) &&
                 ((sVar7 = ar_already_written, sVar14 == 0 ||
                  (sVar18 = fwrite(pcVar11,1,sVar14,__s_12), sVar7 = sVar14, sVar18 == sVar14))))
              goto LAB_00255b05;
            }
LAB_00255c18:
            fclose(__stream);
            iVar9 = -2;
            goto LAB_00255c27;
          }
          iVar9 = -1;
LAB_00255bdc:
          pbVar24 = pbVar24 + 1;
        } while (pbVar24 !=
                 arFiles.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
        fclose(__s_12);
        if (iVar9 != 0) goto LAB_00255c2f;
      }
      iVar9 = 1;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)outputFileName._M_dataplus._M_p != &outputFileName.field_2) {
      operator_delete(outputFileName._M_dataplus._M_p,
                      outputFileName.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)topLevelString._M_dataplus._M_p != &topLevelString.field_2) {
      operator_delete(topLevelString._M_dataplus._M_p,
                      topLevelString.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&arFiles);
  }
  else {
    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)
         &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)&out,"CPACK_TOPLEVEL_DIRECTORY","");
    pcVar10 = cmCPackGenerator::GetOption(&local_23c8->super_cmCPackGenerator,(string *)&out);
    std::__cxx11::string::string((string *)&topLevelString,pcVar10,(allocator *)&dirName);
    if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
        (_func_int **)
        &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
      operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                      _vptr_basic_ostream,
                      out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ +
                      1);
    }
    std::__cxx11::string::append((char *)&topLevelString);
    cmGeneratedFileStream::cmGeneratedFileStream(&out,topLevelString._M_dataplus._M_p,false);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"# Run command: ",0xf);
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&out,cmd._M_dataplus._M_p,cmd._M_string_length);
    std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
    std::ostream::put((char)poVar13);
    poVar13 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"# Working directory: ",0x15);
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar13,(local_23c8->super_cmCPackGenerator).toplevel._M_dataplus._M_p,
                         (local_23c8->super_cmCPackGenerator).toplevel._M_string_length);
    std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
    std::ostream::put((char)poVar13);
    poVar13 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"# Output:",9);
    std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
    std::ostream::put((char)poVar13);
    poVar13 = (ostream *)std::ostream::flush();
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar13,output._M_dataplus._M_p,output._M_string_length);
    std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
    std::ostream::put((char)poVar13);
    std::ostream::flush();
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dirName);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&dirName,"Problem running tar command: ",0x1d);
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&dirName,cmd._M_dataplus._M_p,cmd._M_string_length);
    std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
    std::ostream::put((char)poVar13);
    poVar13 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"Please check ",0xd);
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar13,topLevelString._M_dataplus._M_p,topLevelString._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13," for errors",0xb);
    std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
    std::ostream::put((char)poVar13);
    std::ostream::flush();
    pcVar2 = (local_23c8->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    _Var23 = outputFileName._M_dataplus;
    sVar14 = strlen(outputFileName._M_dataplus._M_p);
    cmCPackLog::Log(pcVar2,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                    ,0x23b,_Var23._M_p,sVar14);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)outputFileName._M_dataplus._M_p != &outputFileName.field_2) {
      operator_delete(outputFileName._M_dataplus._M_p,
                      outputFileName.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dirName);
    std::ios_base::~ios_base(local_2200);
    cmGeneratedFileStream::~cmGeneratedFileStream(&out);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)topLevelString._M_dataplus._M_p != &topLevelString.field_2) {
      operator_delete(topLevelString._M_dataplus._M_p,
                      topLevelString.field_2._M_allocated_capacity + 1);
    }
    iVar9 = 0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)md5filename._M_dataplus._M_p != &md5filename.field_2) {
    operator_delete(md5filename._M_dataplus._M_p,
                    CONCAT71(md5filename.field_2._M_allocated_capacity._1_7_,
                             md5filename.field_2._M_local_buf[0]) + 1);
  }
LAB_00255dc5:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)output._M_dataplus._M_p != &output.field_2) {
    operator_delete(output._M_dataplus._M_p,
                    CONCAT71(output.field_2._M_allocated_capacity._1_7_,
                             output.field_2._M_local_buf[0]) + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&installDirs._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)compression_suffix._M_dataplus._M_p != &compression_suffix.field_2) {
    operator_delete(compression_suffix._M_dataplus._M_p,
                    CONCAT71(compression_suffix.field_2._M_allocated_capacity._1_7_,
                             compression_suffix.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)compression_modifier._M_dataplus._M_p != &compression_modifier.field_2) {
    operator_delete(compression_modifier._M_dataplus._M_p,
                    compression_modifier.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cmake_tar._M_dataplus._M_p != &cmake_tar.field_2) {
    operator_delete(cmake_tar._M_dataplus._M_p,cmake_tar.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cmd._M_dataplus._M_p != &cmd.field_2) {
    operator_delete(cmd._M_dataplus._M_p,cmd.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)debian_pkg_name._M_dataplus._M_p != &debian_pkg_name.field_2) {
    operator_delete(debian_pkg_name._M_dataplus._M_p,
                    debian_pkg_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)ctlfilename._M_dataplus._M_p != &ctlfilename.field_2) {
    operator_delete(ctlfilename._M_dataplus._M_p,
                    CONCAT71(ctlfilename.field_2._M_allocated_capacity._1_7_,
                             ctlfilename.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)dbfilename._M_dataplus._M_p != &dbfilename.field_2) {
    operator_delete(dbfilename._M_dataplus._M_p,
                    CONCAT71(dbfilename.field_2._M_allocated_capacity._1_7_,
                             dbfilename.field_2._M_local_buf[0]) + 1);
  }
  return iVar9;
}

Assistant:

int cmCPackDebGenerator::createDeb()
{
  // debian-binary file
  std::string dbfilename;
    dbfilename += this->GetOption("GEN_WDIR");
  dbfilename += "/debian-binary";
    { // the scope is needed for cmGeneratedFileStream
    cmGeneratedFileStream out(dbfilename.c_str());
    out << "2.0";
    out << std::endl; // required for valid debian package
    }

  // control file
  std::string ctlfilename;
    ctlfilename = this->GetOption("GEN_WDIR");
  ctlfilename += "/control";

  // debian policy enforce lower case for package name
  // mandatory entries:
  std::string debian_pkg_name = cmsys::SystemTools::LowerCase(
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_NAME") );
  const char* debian_pkg_version =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_VERSION");
  const char* debian_pkg_section =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_SECTION");
  const char* debian_pkg_priority =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_PRIORITY");
  const char* debian_pkg_arch =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_ARCHITECTURE");
  const char* maintainer =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_MAINTAINER");
  const char* desc =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_DESCRIPTION");

  // optional entries
  const char* debian_pkg_dep =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_DEPENDS");
  const char* debian_pkg_rec =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_RECOMMENDS");
  const char* debian_pkg_sug =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_SUGGESTS");
  const char* debian_pkg_url =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_HOMEPAGE");
  const char* debian_pkg_predep =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_PREDEPENDS");
  const char* debian_pkg_enhances =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_ENHANCES");
  const char* debian_pkg_breaks =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_BREAKS");
  const char* debian_pkg_conflicts =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_CONFLICTS");
  const char* debian_pkg_provides =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_PROVIDES");
  const char* debian_pkg_replaces =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_REPLACES");

    { // the scope is needed for cmGeneratedFileStream
    cmGeneratedFileStream out(ctlfilename.c_str());
    out << "Package: " << debian_pkg_name << "\n";
    out << "Version: " << debian_pkg_version << "\n";
    out << "Section: " << debian_pkg_section << "\n";
    out << "Priority: " << debian_pkg_priority << "\n";
    out << "Architecture: " << debian_pkg_arch << "\n";
    if(debian_pkg_dep && *debian_pkg_dep)
      {
      out << "Depends: " << debian_pkg_dep << "\n";
      }
    if(debian_pkg_rec && *debian_pkg_rec)
      {
      out << "Recommends: " << debian_pkg_rec << "\n";
      }
    if(debian_pkg_sug && *debian_pkg_sug)
      {
      out << "Suggests: " << debian_pkg_sug << "\n";
      }
    if(debian_pkg_url && *debian_pkg_url)
      {
      out << "Homepage: " << debian_pkg_url << "\n";
      }
    if (debian_pkg_predep && *debian_pkg_predep)
      {
      out << "Pre-Depends: " << debian_pkg_predep << "\n";
      }
    if (debian_pkg_enhances && *debian_pkg_enhances)
      {
      out << "Enhances: " << debian_pkg_enhances << "\n";
      }
    if (debian_pkg_breaks && *debian_pkg_breaks)
      {
      out << "Breaks: " << debian_pkg_breaks << "\n";
      }
    if (debian_pkg_conflicts && *debian_pkg_conflicts)
      {
      out << "Conflicts: " << debian_pkg_conflicts << "\n";
      }
    if (debian_pkg_provides && *debian_pkg_provides)
      {
      out << "Provides: " << debian_pkg_provides << "\n";
      }
    if (debian_pkg_replaces && *debian_pkg_replaces)
      {
      out << "Replaces: " << debian_pkg_replaces << "\n";
      }
    unsigned long totalSize = 0;
    {
      std::string dirName = this->GetOption("CPACK_TEMPORARY_DIRECTORY");
      dirName += '/';
        for (std::vector<std::string>::const_iterator fileIt =
              packageFiles.begin();
              fileIt != packageFiles.end(); ++ fileIt )
        {
        totalSize += cmSystemTools::FileLength(*fileIt);
        }
    }
    out << "Installed-Size: " << (totalSize + 1023) / 1024 << "\n";
    out << "Maintainer: " << maintainer << "\n";
    out << "Description: " << desc << "\n";
    out << std::endl;
    }

  std::string cmd(this->GetOption("GEN_CPACK_DEBIAN_FAKEROOT_EXECUTABLE"));

  const char* debian_compression_type =
      this->GetOption("GEN_CPACK_DEBIAN_COMPRESSION_TYPE");
  if(!debian_compression_type)
    {
    debian_compression_type = "gzip";
    }

  std::string cmake_tar = " ", compression_modifier = "a", compression_suffix;
  if(!strcmp(debian_compression_type, "lzma")) {
      compression_suffix = ".lzma";
  } else if(!strcmp(debian_compression_type, "xz")) {
      compression_suffix = ".xz";
  } else if(!strcmp(debian_compression_type, "bzip2")) {
      compression_suffix = ".bz2";
      compression_modifier = "j";
      cmake_tar += "\"" + cmSystemTools::GetCMakeCommand() + "\" -E ";
  } else if(!strcmp(debian_compression_type, "gzip")) {
      compression_suffix = ".gz";
      compression_modifier = "z";
      cmake_tar += "\"" + cmSystemTools::GetCMakeCommand() + "\" -E ";
  } else if(!strcmp(debian_compression_type, "none")) {
      compression_suffix = "";
      compression_modifier = "";
      cmake_tar += "\"" + cmSystemTools::GetCMakeCommand() + "\" -E ";
  } else {
      cmCPackLogger(cmCPackLog::LOG_ERROR,
                    "Error unrecognized compression type: "
                    << debian_compression_type << std::endl);
  }

  cmd += cmake_tar + "tar c" + compression_modifier + "f data.tar"
      + compression_suffix;

  // now add all directories which have to be compressed
  // collect all top level install dirs for that
  // e.g. /opt/bin/foo, /usr/bin/bar and /usr/bin/baz would give /usr and /opt
    size_t topLevelLength = std::string(this->GetOption("GEN_WDIR")).length();
    cmCPackLogger(cmCPackLog::LOG_DEBUG, "WDIR: \""
          << this->GetOption("GEN_WDIR")
          << "\", length = " << topLevelLength
          << std::endl);
  std::set<std::string> installDirs;
    for (std::vector<std::string>::const_iterator fileIt =
        packageFiles.begin();
        fileIt != packageFiles.end(); ++ fileIt )
    {
      cmCPackLogger(cmCPackLog::LOG_DEBUG, "FILEIT: \"" << *fileIt << "\""
          << std::endl);
    std::string::size_type slashPos = fileIt->find('/', topLevelLength+1);
    std::string relativeDir = fileIt->substr(topLevelLength,
                                             slashPos - topLevelLength);
      cmCPackLogger(cmCPackLog::LOG_DEBUG, "RELATIVEDIR: \"" << relativeDir
      << "\"" << std::endl);
    if (installDirs.find(relativeDir) == installDirs.end())
      {
      installDirs.insert(relativeDir);
      cmd += " .";
      cmd += relativeDir;
      }
    }

  std::string output;
    int retval = -1;
  int res = cmSystemTools::RunSingleCommand(cmd.c_str(), &output, &output,
      &retval, this->GetOption("GEN_WDIR"), this->GeneratorVerbose, 0);

    if ( !res || retval )
    {
    std::string tmpFile = this->GetOption("CPACK_TOPLEVEL_DIRECTORY");
    tmpFile += "/Deb.log";
    cmGeneratedFileStream ofs(tmpFile.c_str());
    ofs << "# Run command: " << cmd << std::endl
      << "# Working directory: " << toplevel << std::endl
      << "# Output:" << std::endl
      << output << std::endl;
    cmCPackLogger(cmCPackLog::LOG_ERROR, "Problem running tar command: "
      << cmd << std::endl
      << "Please check " << tmpFile << " for errors" << std::endl);
    return 0;
    }

  std::string md5filename;
    md5filename = this->GetOption("GEN_WDIR");
  md5filename += "/md5sums";

    { // the scope is needed for cmGeneratedFileStream
    cmGeneratedFileStream out(md5filename.c_str());
    std::vector<std::string>::const_iterator fileIt;
//       std::string topLevelWithTrailingSlash = toplevel;
    std::string topLevelWithTrailingSlash =
        this->GetOption("CPACK_TEMPORARY_DIRECTORY");
    topLevelWithTrailingSlash += '/';
      for ( fileIt = packageFiles.begin();
            fileIt != packageFiles.end(); ++ fileIt )
      {
      cmd = "\"";
      cmd += cmSystemTools::GetCMakeCommand();
      cmd += "\" -E md5sum \"";
      cmd += *fileIt;
      cmd += "\"";
      //std::string output;
      //int retVal = -1;
      res = cmSystemTools::RunSingleCommand(cmd.c_str(), &output, &output,
          &retval, toplevel.c_str(), this->GeneratorVerbose, 0);
      if ( !res || retval )
        {
        cmCPackLogger(cmCPackLog::LOG_ERROR, "Problem running cmake -E md5sum "
                      << cmd << std::endl);
        }
      // debian md5sums entries are like this:
      // 014f3604694729f3bf19263bac599765  usr/bin/ccmake
      // thus strip the full path (with the trailing slash)
      cmSystemTools::ReplaceString(output,
                                   topLevelWithTrailingSlash.c_str(), "");
      out << output;
      }
    // each line contains a eol.
    // Do not end the md5sum file with yet another (invalid)
    }

    // set md5sum file permissins to RW-R--R-- so that deb lintian doesn't warn
    // about it
    cmSystemTools::SetPermissions(md5filename.c_str(),
        S_IRUSR | S_IWUSR | S_IRGRP | S_IROTH);

    cmd = this->GetOption("GEN_CPACK_DEBIAN_FAKEROOT_EXECUTABLE");
    cmd += cmake_tar + "tar czf control.tar.gz ./control ./md5sums";
    const char* controlExtra =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_CONTROL_EXTRA");
  if( controlExtra )
    {
    std::vector<std::string> controlExtraList;
    cmSystemTools::ExpandListArgument(controlExtra, controlExtraList);
    for(std::vector<std::string>::iterator i =
          controlExtraList.begin(); i != controlExtraList.end(); ++i)
      {
      std::string filenamename =
        cmsys::SystemTools::GetFilenameName(*i);
      std::string localcopy = this->GetOption("GEN_WDIR");
      localcopy += "/";
      localcopy += filenamename;
      // if we can copy the file, it means it does exist, let's add it:
      if( cmsys::SystemTools::CopyFileIfDifferent(
            *i, localcopy) )
        {
        // debian is picky and need relative to ./ path in the tar.*
        cmd += " ./";
        cmd += filenamename;
        }
      }
    }
  res = cmSystemTools::RunSingleCommand(cmd.c_str(), &output, &output,
      &retval, this->GetOption("GEN_WDIR"), this->GeneratorVerbose, 0);

    if ( !res || retval )
    {
    std::string tmpFile = this->GetOption("CPACK_TOPLEVEL_DIRECTORY");
    tmpFile += "/Deb.log";
    cmGeneratedFileStream ofs(tmpFile.c_str());
    ofs << "# Run command: " << cmd << std::endl
      << "# Working directory: " << toplevel << std::endl
      << "# Output:" << std::endl
      << output << std::endl;
    cmCPackLogger(cmCPackLog::LOG_ERROR, "Problem running tar command: "
      << cmd << std::endl
      << "Please check " << tmpFile << " for errors" << std::endl);
    return 0;
    }

  // ar -r your-package-name.deb debian-binary control.tar.* data.tar.*
  // since debian packages require BSD ar (most Linux distros and even
  // FreeBSD and NetBSD ship GNU ar) we use a copy of OpenBSD ar here.
  std::vector<std::string> arFiles;
    std::string topLevelString = this->GetOption("GEN_WDIR");
  topLevelString += "/";
  arFiles.push_back(topLevelString + "debian-binary");
  arFiles.push_back(topLevelString + "control.tar.gz");
  arFiles.push_back(topLevelString + "data.tar" + compression_suffix);
    std::string outputFileName = this->GetOption("CPACK_TOPLEVEL_DIRECTORY");
    outputFileName += "/";
    outputFileName += this->GetOption("CPACK_OUTPUT_FILE_NAME");
    res = ar_append(outputFileName.c_str(), arFiles);
  if ( res!=0 )
    {
    std::string tmpFile = this->GetOption("CPACK_TEMPORARY_PACKAGE_FILE_NAME");
    tmpFile += "/Deb.log";
    cmGeneratedFileStream ofs(tmpFile.c_str());
    ofs << "# Problem creating archive using: " << res << std::endl;
    return 0;
    }
  return 1;
}